

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-display.c
# Opt level: O3

uint8_t monster_health_attr(void)

{
  monster *mon;
  _Bool _Var1;
  byte bVar2;
  int iVar3;
  byte bVar4;
  
  mon = player->upkeep->health_who;
  if (mon == (monster *)0x0) {
    bVar2 = 0;
  }
  else {
    _Var1 = monster_is_visible(mon);
    bVar2 = 1;
    if (((_Var1) && (-1 < mon->hp)) && (player->timed[6] == 0)) {
      iVar3 = (mon->hp * 100) / (int)mon->maxhp;
      bVar2 = 3;
      if (iVar3 < 0x19) {
        bVar2 = (9 < iVar3) << 3 | 4;
      }
      bVar4 = 0xb;
      if (iVar3 < 0x3c) {
        bVar4 = bVar2;
      }
      bVar2 = 0xd;
      if (iVar3 < 100) {
        bVar2 = bVar4;
      }
      bVar4 = 0x11;
      if (mon->m_timed[3] == 0) {
        bVar4 = bVar2;
      }
      bVar2 = 0xf;
      if (mon->m_timed[7] == 0) {
        bVar2 = bVar4;
      }
      bVar4 = 10;
      if (mon->m_timed[8] == 0) {
        bVar4 = bVar2;
      }
      bVar2 = 7;
      if (mon->m_timed[2] == 0) {
        bVar2 = bVar4;
      }
      bVar4 = 0xe;
      if (mon->m_timed[1] == 0) {
        bVar4 = bVar2;
      }
      bVar2 = 6;
      if (mon->m_timed[0] == 0 && mon->m_timed[6] == 0) {
        bVar2 = bVar4;
      }
    }
  }
  return bVar2;
}

Assistant:

uint8_t monster_health_attr(void)
{
	struct monster *mon = player->upkeep->health_who;
	uint8_t attr;

	if (!mon) {
		/* Not tracking */
		attr = COLOUR_DARK;

	} else if (!monster_is_visible(mon) || mon->hp < 0 ||
			   player->timed[TMD_IMAGE]) {
		/* The monster health is "unknown" */
		attr = COLOUR_WHITE;

	} else {
		int pct;

		/* Default to almost dead */
		attr = COLOUR_RED;

		/* Extract the "percent" of health */
		pct = 100L * mon->hp / mon->maxhp;

		/* Badly wounded */
		if (pct >= 10) attr = COLOUR_L_RED;

		/* Wounded */
		if (pct >= 25) attr = COLOUR_ORANGE;

		/* Somewhat Wounded */
		if (pct >= 60) attr = COLOUR_YELLOW;

		/* Healthy */
		if (pct >= 100) attr = COLOUR_L_GREEN;

		/* Afraid */
		if (mon->m_timed[MON_TMD_FEAR]) attr = COLOUR_VIOLET;

		/* Disenchanted */
		if (mon->m_timed[MON_TMD_DISEN]) attr = COLOUR_L_UMBER;

		/* Commanded */
		if (mon->m_timed[MON_TMD_COMMAND]) attr = COLOUR_L_PURPLE;

		/* Confused */
		if (mon->m_timed[MON_TMD_CONF]) attr = COLOUR_UMBER;

		/* Stunned */
		if (mon->m_timed[MON_TMD_STUN]) attr = COLOUR_L_BLUE;

		/* Asleep */
		if (mon->m_timed[MON_TMD_SLEEP]) attr = COLOUR_BLUE;

		/* Held */
		if (mon->m_timed[MON_TMD_HOLD]) attr = COLOUR_BLUE;
	}

	return attr;
}